

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint in_EDI;
  LlamaData llama_data;
  int ret;
  Opt opt;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  LlamaData local_1f8;
  string local_198 [32];
  undefined4 local_178;
  int local_164;
  EVP_PKEY_CTX local_160 [64];
  Opt *in_stack_fffffffffffffee0;
  LlamaData *in_stack_fffffffffffffee8;
  string local_60 [88];
  uint local_8;
  int local_4;
  
  local_4 = 0;
  local_8 = in_EDI;
  ctrl_c_handling();
  Opt::Opt((Opt *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  local_164 = Opt::init((Opt *)local_160,(EVP_PKEY_CTX *)(ulong)local_8);
  if (local_164 == 2) {
    local_4 = 0;
    local_178 = 1;
  }
  else if (local_164 == 0) {
    bVar1 = is_stdin_a_terminal();
    if (!bVar1) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::operator+=(local_60,"\n\n");
      }
      read_pipe_data_abi_cxx11_();
      std::__cxx11::string::operator+=(local_60,local_198);
      std::__cxx11::string::~string(local_198);
    }
    llama_log_set(log_callback,local_160);
    LlamaData::LlamaData((LlamaData *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0))
    ;
    iVar2 = LlamaData::init(&local_1f8,local_160);
    if (iVar2 == 0) {
      in_stack_fffffffffffffde4 = chat_loop(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      if (in_stack_fffffffffffffde4 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
    local_178 = 1;
    LlamaData::~LlamaData
              ((LlamaData *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  }
  else {
    local_4 = 1;
    local_178 = 1;
  }
  Opt::~Opt((Opt *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  return local_4;
}

Assistant:

int main(int argc, const char ** argv) {
    ctrl_c_handling();
    Opt       opt;
    const int ret = opt.init(argc, argv);
    if (ret == 2) {
        return 0;
    } else if (ret) {
        return 1;
    }

    if (!is_stdin_a_terminal()) {
        if (!opt.user.empty()) {
            opt.user += "\n\n";
        }

        opt.user += read_pipe_data();
    }

    llama_log_set(log_callback, &opt);
    LlamaData llama_data;
    if (llama_data.init(opt)) {
        return 1;
    }

    if (chat_loop(llama_data, opt)) {
        return 1;
    }

    return 0;
}